

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# san.c
# Opt level: O1

void duckdb_je_tsd_san_init(tsd_t *tsd)

{
  tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_san_extents_until_guard_small =
       duckdb_je_opt_san_guard_small;
  tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_san_extents_until_guard_large =
       duckdb_je_opt_san_guard_large;
  return;
}

Assistant:

void
tsd_san_init(tsd_t *tsd) {
	*tsd_san_extents_until_guard_smallp_get(tsd) = opt_san_guard_small;
	*tsd_san_extents_until_guard_largep_get(tsd) = opt_san_guard_large;
}